

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O2

int check_crl_time(X509_STORE_CTX *ctx,X509_CRL *crl,int notify)

{
  ulong uVar1;
  int iVar2;
  int64_t cmp_time;
  ASN1_TIME *pAVar3;
  
  uVar1 = ctx->param->flags;
  if (((uint)uVar1 >> 0x15 & 1) == 0) {
    if (notify != 0) {
      ctx->current_crl = crl;
    }
    if ((uVar1 & 2) == 0) {
      cmp_time = time((time_t *)0x0);
    }
    else {
      cmp_time = ctx->param->check_time;
    }
    pAVar3 = X509_CRL_get0_lastUpdate(crl);
    iVar2 = X509_cmp_time_posix(pAVar3,cmp_time);
    if (iVar2 == 0) {
      if (notify != 0) {
        ctx->error = 0xf;
LAB_001a1213:
        iVar2 = call_verify_cb(0,ctx);
        if (iVar2 == 0) {
          return 0;
        }
        goto LAB_001a1224;
      }
    }
    else if (iVar2 < 1) {
LAB_001a1224:
      pAVar3 = X509_CRL_get0_nextUpdate(crl);
      if (pAVar3 == (ASN1_TIME *)0x0) {
LAB_001a124a:
        if (notify == 0) goto LAB_001a127e;
LAB_001a1279:
        ctx->current_crl = (X509_CRL *)0x0;
        goto LAB_001a127e;
      }
      pAVar3 = X509_CRL_get0_nextUpdate(crl);
      iVar2 = X509_cmp_time_posix(pAVar3,cmp_time);
      if (iVar2 == 0) {
        if (notify != 0) {
          ctx->error = 0x10;
LAB_001a1268:
          iVar2 = call_verify_cb(0,ctx);
          if (iVar2 == 0) {
            return 0;
          }
          goto LAB_001a1279;
        }
      }
      else {
        if (-1 < iVar2) goto LAB_001a124a;
        if (notify != 0) {
          ctx->error = 0xc;
          goto LAB_001a1268;
        }
      }
    }
    else if (notify != 0) {
      ctx->error = 0xb;
      goto LAB_001a1213;
    }
    iVar2 = 0;
  }
  else {
LAB_001a127e:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int check_crl_time(X509_STORE_CTX *ctx, X509_CRL *crl, int notify) {
  if (ctx->param->flags & X509_V_FLAG_NO_CHECK_TIME) {
    return 1;
  }

  if (notify) {
    ctx->current_crl = crl;
  }
  int64_t ptime;
  if (ctx->param->flags & X509_V_FLAG_USE_CHECK_TIME) {
    ptime = ctx->param->check_time;
  } else {
    ptime = time(NULL);
  }

  int i = X509_cmp_time_posix(X509_CRL_get0_lastUpdate(crl), ptime);
  if (i == 0) {
    if (!notify) {
      return 0;
    }
    ctx->error = X509_V_ERR_ERROR_IN_CRL_LAST_UPDATE_FIELD;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  if (i > 0) {
    if (!notify) {
      return 0;
    }
    ctx->error = X509_V_ERR_CRL_NOT_YET_VALID;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  if (X509_CRL_get0_nextUpdate(crl)) {
    i = X509_cmp_time_posix(X509_CRL_get0_nextUpdate(crl), ptime);

    if (i == 0) {
      if (!notify) {
        return 0;
      }
      ctx->error = X509_V_ERR_ERROR_IN_CRL_NEXT_UPDATE_FIELD;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }
    if (i < 0) {
      if (!notify) {
        return 0;
      }
      ctx->error = X509_V_ERR_CRL_HAS_EXPIRED;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }
  }

  if (notify) {
    ctx->current_crl = NULL;
  }

  return 1;
}